

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

void __thiscall
slang::ast::Expression::PropagationVisitor::updateRange(PropagationVisitor *this,Expression *expr)

{
  SourceLocation startLoc;
  BinaryExpression *pBVar1;
  ConditionalExpression *pCVar2;
  SourceLocation endLoc;
  Expression *in_RSI;
  long in_RDI;
  SourceLocation opLoc;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ExpressionKind delta;
  SourceLocation *in_stack_ffffffffffffffb8;
  SourceRange local_38;
  SourceLocation local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  Expression *local_10;
  
  local_10 = in_RSI;
  SourceRange::SourceRange
            ((SourceRange *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *(undefined8 *)(in_RDI + 0x18) = local_20;
  *(undefined8 *)(in_RDI + 0x20) = uStack_18;
  delta = local_10->kind;
  if (delta == BinaryOp) {
    pBVar1 = as<slang::ast::BinaryExpression>(local_10);
    *(SourceLocation *)(in_RDI + 0x18) = (pBVar1->opRange).startLoc;
    *(SourceLocation *)(in_RDI + 0x20) = (pBVar1->opRange).endLoc;
  }
  else if (delta == ConditionalOp) {
    pCVar2 = as<slang::ast::ConditionalExpression>(local_10);
    startLoc = pCVar2->opLoc;
    local_28 = startLoc;
    endLoc = SourceLocation::operator+<int>(in_stack_ffffffffffffffb8,delta);
    SourceRange::SourceRange(&local_38,startLoc,endLoc);
    *(SourceLocation *)(in_RDI + 0x18) = local_38.startLoc;
    *(SourceLocation *)(in_RDI + 0x20) = local_38.endLoc;
  }
  return;
}

Assistant:

void updateRange(const Expression& expr) {
        opRange = {};
        switch (expr.kind) {
            case ExpressionKind::BinaryOp:
                opRange = expr.as<BinaryExpression>().opRange;
                break;
            case ExpressionKind::ConditionalOp: {
                auto opLoc = expr.as<ConditionalExpression>().opLoc;
                opRange = {opLoc, opLoc + 1};
                break;
            }
            default:
                break;
        }
    }